

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

ImVec2 ImGui::NavCalcPreferredRefPos(void)

{
  ImVec2 *mouse_pos;
  ImGuiNavLayer IVar1;
  ImGuiWindow *pIVar2;
  ImGuiContext *pIVar3;
  bool bVar4;
  ImGuiContext *g;
  float fVar5;
  ImVec2 IVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  
  pIVar3 = GImGui;
  if (((GImGui->NavDisableHighlight == false) && (GImGui->NavDisableMouseHover == true)) &&
     (pIVar2 = GImGui->NavWindow, pIVar2 != (ImGuiWindow *)0x0)) {
    IVar1 = GImGui->NavLayer;
    fVar5 = (GImGui->Style).FramePadding.x * 4.0;
    fVar9 = pIVar2->NavRectRel[IVar1].Min.x;
    fVar7 = pIVar2->NavRectRel[IVar1].Max.x - fVar9;
    if (fVar7 <= fVar5) {
      fVar5 = fVar7;
    }
    fVar7 = pIVar2->NavRectRel[IVar1].Max.y;
    fVar8 = (GImGui->Style).FramePadding.y;
    fVar10 = fVar7 - pIVar2->NavRectRel[IVar1].Min.y;
    if (fVar10 <= fVar8) {
      fVar8 = fVar10;
    }
    fVar10 = fVar5 + fVar9 + (pIVar2->Pos).x;
    fVar7 = (fVar7 - fVar8) + (pIVar2->Pos).y;
    fVar9 = (GImGui->IO).DisplaySize.x;
    fVar5 = (GImGui->IO).DisplaySize.y;
    if (fVar7 <= fVar5) {
      fVar5 = fVar7;
    }
    if (fVar10 <= fVar9) {
      fVar9 = fVar10;
    }
    IVar6.x = (float)(int)(float)(~-(uint)(fVar10 < 0.0) & (uint)fVar9);
    IVar6.y = (float)(int)(float)(~-(uint)(fVar7 < 0.0) & (uint)fVar5);
  }
  else {
    mouse_pos = &(GImGui->IO).MousePos;
    bVar4 = IsMousePosValid(mouse_pos);
    if (bVar4) {
      IVar6 = *mouse_pos;
    }
    else {
      IVar6 = pIVar3->LastValidMousePos;
    }
  }
  return IVar6;
}

Assistant:

static ImVec2 ImGui::NavCalcPreferredRefPos()
{
    ImGuiContext& g = *GImGui;
    if (g.NavDisableHighlight || !g.NavDisableMouseHover || !g.NavWindow)
    {
        // Mouse (we need a fallback in case the mouse becomes invalid after being used)
        if (IsMousePosValid(&g.IO.MousePos))
            return g.IO.MousePos;
        return g.LastValidMousePos;
    }
    else
    {
        // When navigation is active and mouse is disabled, decide on an arbitrary position around the bottom left of the currently navigated item.
        const ImRect& rect_rel = g.NavWindow->NavRectRel[g.NavLayer];
        ImVec2 pos = g.NavWindow->Pos + ImVec2(rect_rel.Min.x + ImMin(g.Style.FramePadding.x * 4, rect_rel.GetWidth()), rect_rel.Max.y - ImMin(g.Style.FramePadding.y, rect_rel.GetHeight()));
        ImRect visible_rect = GetViewportRect();
        return ImFloor(ImClamp(pos, visible_rect.Min, visible_rect.Max));   // ImFloor() is important because non-integer mouse position application in back-end might be lossy and result in undesirable non-zero delta.
    }
}